

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddFuncs.c
# Opt level: O2

DdNode * cuddZddWeakDivF(DdManager *dd,DdNode *f,DdNode *g)

{
  uint v;
  int iVar1;
  int iVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  uint v_00;
  DdNode *fd;
  DdNode *f1;
  DdNode *f0;
  DdNode *gd;
  DdNode *g1;
  DdNode *g0;
  DdNode *local_60;
  DdNode *local_58;
  DdNode *local_50;
  DdNode *local_48;
  DdNode *local_40;
  DdNode *local_38;
  
  pDVar3 = dd->one;
  if (pDVar3 == g) {
    return f;
  }
  pDVar6 = dd->zero;
  if (pDVar3 == f || pDVar6 == f) {
    return pDVar6;
  }
  if (f == g) {
    return pDVar3;
  }
  pDVar3 = cuddCacheLookup2Zdd(dd,cuddZddWeakDivF,f,g);
  if (pDVar3 != (DdNode *)0x0) {
    return pDVar3;
  }
  v = f->index;
  iVar2 = dd->permZ[v];
  iVar1 = dd->permZ[g->index];
  v_00 = g->index;
  if ((iVar1 < iVar2) || (v_00 = v, iVar1 >> 1 <= iVar2 >> 1)) {
    iVar2 = cuddZddGetCofactors3(dd,f,v_00,&local_58,&local_50,&local_60);
    if (iVar2 != 0) {
      return (DdNode *)0x0;
    }
    Cudd_Ref(local_58);
    Cudd_Ref(local_50);
    Cudd_Ref(local_60);
    iVar2 = cuddZddGetCofactors3(dd,g,v_00,&local_40,&local_38,&local_48);
    if (iVar2 != 0) {
      Cudd_RecursiveDerefZdd(dd,local_58);
      Cudd_RecursiveDerefZdd(dd,local_50);
      pDVar3 = local_60;
      goto LAB_00636c85;
    }
    Cudd_Ref(local_40);
    Cudd_Ref(local_38);
    Cudd_Ref(local_48);
    pDVar4 = g;
    pDVar3 = local_48;
    if ((local_38 != pDVar6) &&
       (pDVar4 = cuddZddWeakDivF(dd,local_50,local_38), pDVar4 == (DdNode *)0x0)) {
      Cudd_RecursiveDerefZdd(dd,local_58);
      Cudd_RecursiveDerefZdd(dd,local_50);
      Cudd_RecursiveDerefZdd(dd,local_60);
      Cudd_RecursiveDerefZdd(dd,local_40);
      goto LAB_00636c58;
    }
    Cudd_Ref(pDVar4);
    Cudd_RecursiveDerefZdd(dd,local_50);
    Cudd_RecursiveDerefZdd(dd,local_38);
    if (pDVar4 == pDVar6) {
      Cudd_RecursiveDerefZdd(dd,local_58);
      Cudd_RecursiveDerefZdd(dd,local_40);
      Cudd_RecursiveDerefZdd(dd,local_60);
      goto LAB_00636d79;
    }
    if (local_40 != pDVar6) {
      Cudd_RecursiveDerefZdd(dd,pDVar4);
      pDVar5 = cuddZddWeakDivF(dd,local_58,local_40);
      local_38 = local_60;
      if (pDVar5 == (DdNode *)0x0) {
        Cudd_RecursiveDerefZdd(dd,local_58);
        Cudd_RecursiveDerefZdd(dd,local_40);
      }
      else {
        Cudd_Ref(pDVar5);
        Cudd_RecursiveDerefZdd(dd,local_58);
        Cudd_RecursiveDerefZdd(dd,local_40);
        if (pDVar4 == g) goto LAB_00636ca2;
        pDVar4 = cuddZddIntersect(dd,pDVar4,pDVar5);
        if (pDVar4 != (DdNode *)0x0) {
          Cudd_Ref(pDVar4);
          local_40 = pDVar5;
          goto LAB_00636c0c;
        }
      }
LAB_00636c58:
      Cudd_RecursiveDerefZdd(dd,local_38);
      goto LAB_00636c85;
    }
    Cudd_RecursiveDerefZdd(dd,local_58);
LAB_00636c0c:
    Cudd_RecursiveDerefZdd(dd,local_40);
    pDVar5 = pDVar4;
LAB_00636ca2:
    if (pDVar5 == pDVar6) {
      Cudd_RecursiveDerefZdd(dd,local_60);
      pDVar4 = pDVar5;
LAB_00636d79:
      Cudd_RecursiveDerefZdd(dd,local_48);
      cuddCacheInsert2(dd,cuddZddWeakDivF,f,g,pDVar6);
      Cudd_Deref(pDVar4);
      return pDVar6;
    }
    if (local_48 == pDVar6) goto LAB_00636d39;
    Cudd_RecursiveDerefZdd(dd,pDVar5);
    pDVar3 = cuddZddWeakDivF(dd,local_60,local_48);
    pDVar6 = local_48;
    if (pDVar3 == (DdNode *)0x0) goto LAB_00636da3;
    Cudd_Ref(pDVar3);
    Cudd_RecursiveDerefZdd(dd,local_60);
    Cudd_RecursiveDerefZdd(dd,local_48);
    if (pDVar5 == g) goto LAB_00636d49;
    pDVar5 = cuddZddIntersect(dd,pDVar5,pDVar3);
    if (pDVar5 == (DdNode *)0x0) goto LAB_00636c85;
    Cudd_Ref(pDVar5);
LAB_00636d44:
    Cudd_RecursiveDerefZdd(dd,pDVar3);
    pDVar3 = pDVar5;
LAB_00636d49:
    cuddCacheInsert2(dd,cuddZddWeakDivF,f,g,pDVar3);
    Cudd_Deref(pDVar3);
    return pDVar3;
  }
  iVar2 = cuddZddGetCofactors3(dd,f,v,&local_58,&local_50,&local_60);
  if (iVar2 != 0) {
    return (DdNode *)0x0;
  }
  Cudd_Ref(local_58);
  Cudd_Ref(local_50);
  Cudd_Ref(local_60);
  pDVar4 = cuddZddWeakDivF(dd,local_58,g);
  if (pDVar4 == (DdNode *)0x0) {
    Cudd_RecursiveDerefZdd(dd,local_58);
  }
  else {
    Cudd_Ref(pDVar4);
    Cudd_RecursiveDerefZdd(dd,local_58);
    pDVar3 = cuddZddWeakDivF(dd,local_50,g);
    if (pDVar3 == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(dd,local_50);
      local_50 = local_60;
      local_60 = pDVar4;
    }
    else {
      Cudd_Ref(pDVar3);
      Cudd_RecursiveDerefZdd(dd,local_50);
      pDVar5 = cuddZddWeakDivF(dd,local_60,g);
      if (pDVar5 == (DdNode *)0x0) {
        Cudd_RecursiveDerefZdd(dd,local_60);
        Cudd_RecursiveDerefZdd(dd,pDVar4);
        goto LAB_00636c85;
      }
      Cudd_Ref(pDVar5);
      Cudd_RecursiveDerefZdd(dd,local_60);
      pDVar6 = cuddZddGetNode(dd,v | 1,pDVar3,pDVar5);
      if (pDVar6 != (DdNode *)0x0) {
        Cudd_Ref(pDVar6);
        Cudd_RecursiveDerefZdd(dd,pDVar3);
        Cudd_RecursiveDerefZdd(dd,pDVar5);
        pDVar5 = cuddZddGetNode(dd,v & 0xfffffffe,pDVar4,pDVar6);
        local_60 = pDVar4;
        if (pDVar5 == (DdNode *)0x0) {
LAB_00636da3:
          Cudd_RecursiveDerefZdd(dd,local_60);
          pDVar3 = pDVar6;
          goto LAB_00636c85;
        }
        Cudd_Ref(pDVar5);
        pDVar3 = pDVar6;
LAB_00636d39:
        Cudd_RecursiveDerefZdd(dd,local_60);
        goto LAB_00636d44;
      }
      Cudd_RecursiveDerefZdd(dd,pDVar4);
      local_50 = pDVar3;
      local_60 = pDVar5;
    }
  }
  Cudd_RecursiveDerefZdd(dd,local_50);
  pDVar3 = local_60;
LAB_00636c85:
  Cudd_RecursiveDerefZdd(dd,pDVar3);
  return (DdNode *)0x0;
}

Assistant:

DdNode  *
cuddZddWeakDivF(
  DdManager * dd,
  DdNode * f,
  DdNode * g)
{
    int         v, top_f, top_g, vf, vg;
    DdNode      *one = DD_ONE(dd);
    DdNode      *zero = DD_ZERO(dd);
    DdNode      *f0, *f1, *fd, *g0, *g1, *gd;
    DdNode      *q, *tmp;
    DdNode      *r;
    DdNode      *term1, *term0, *termd;
    int         flag;
    int         pv, nv;

    statLine(dd);
    if (g == one)
        return(f);
    if (f == zero || f == one)
        return(zero);
    if (f == g)
        return(one);

    /* Check cache. */
    r = cuddCacheLookup2Zdd(dd, cuddZddWeakDivF, f, g);
    if (r)
        return(r);

    top_f = dd->permZ[f->index];
    top_g = dd->permZ[g->index];
    vf = top_f >> 1;
    vg = top_g >> 1;
    v = ddMin(top_f, top_g);

    if (v == top_f && vf < vg) {
        v = f->index;
        flag = cuddZddGetCofactors3(dd, f, v, &f1, &f0, &fd);
        if (flag == 1)
            return(NULL);
        Cudd_Ref(f1);
        Cudd_Ref(f0);
        Cudd_Ref(fd);

        pv = cuddZddGetPosVarIndex(dd, v);
        nv = cuddZddGetNegVarIndex(dd, v);

        term1 = cuddZddWeakDivF(dd, f1, g);
        if (term1 == NULL) {
            Cudd_RecursiveDerefZdd(dd, f1);
            Cudd_RecursiveDerefZdd(dd, f0);
            Cudd_RecursiveDerefZdd(dd, fd);
            return(NULL);
        }
        Cudd_Ref(term1);
        Cudd_RecursiveDerefZdd(dd, f1);
        term0 = cuddZddWeakDivF(dd, f0, g);
        if (term0 == NULL) {
            Cudd_RecursiveDerefZdd(dd, f0);
            Cudd_RecursiveDerefZdd(dd, fd);
            Cudd_RecursiveDerefZdd(dd, term1);
            return(NULL);
        }
        Cudd_Ref(term0);
        Cudd_RecursiveDerefZdd(dd, f0);
        termd = cuddZddWeakDivF(dd, fd, g);
        if (termd == NULL) {
            Cudd_RecursiveDerefZdd(dd, fd);
            Cudd_RecursiveDerefZdd(dd, term1);
            Cudd_RecursiveDerefZdd(dd, term0);
            return(NULL);
        }
        Cudd_Ref(termd);
        Cudd_RecursiveDerefZdd(dd, fd);

        tmp = cuddZddGetNode(dd, nv, term0, termd); /* nv = zi */
        if (tmp == NULL) {
            Cudd_RecursiveDerefZdd(dd, term1);
            Cudd_RecursiveDerefZdd(dd, term0);
            Cudd_RecursiveDerefZdd(dd, termd);
            return(NULL);
        }
        Cudd_Ref(tmp);
        Cudd_RecursiveDerefZdd(dd, term0);
        Cudd_RecursiveDerefZdd(dd, termd);
        q = cuddZddGetNode(dd, pv, term1, tmp); /* pv = yi */
        if (q == NULL) {
            Cudd_RecursiveDerefZdd(dd, term1);
            Cudd_RecursiveDerefZdd(dd, tmp);
            return(NULL);
        }
        Cudd_Ref(q);
        Cudd_RecursiveDerefZdd(dd, term1);
        Cudd_RecursiveDerefZdd(dd, tmp);

        cuddCacheInsert2(dd, cuddZddWeakDivF, f, g, q);
        Cudd_Deref(q);
        return(q);
    }

    if (v == top_f)
        v = f->index;
    else
        v = g->index;

    flag = cuddZddGetCofactors3(dd, f, v, &f1, &f0, &fd);
    if (flag == 1)
        return(NULL);
    Cudd_Ref(f1);
    Cudd_Ref(f0);
    Cudd_Ref(fd);
    flag = cuddZddGetCofactors3(dd, g, v, &g1, &g0, &gd);
    if (flag == 1) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        Cudd_RecursiveDerefZdd(dd, fd);
        return(NULL);
    }
    Cudd_Ref(g1);
    Cudd_Ref(g0);
    Cudd_Ref(gd);

    q = g;

    if (g0 != zero) {
        q = cuddZddWeakDivF(dd, f0, g0);
        if (q == NULL) {
            Cudd_RecursiveDerefZdd(dd, f1);
            Cudd_RecursiveDerefZdd(dd, f0);
            Cudd_RecursiveDerefZdd(dd, fd);
            Cudd_RecursiveDerefZdd(dd, g1);
            Cudd_RecursiveDerefZdd(dd, g0);
            Cudd_RecursiveDerefZdd(dd, gd);
            return(NULL);
        }
        Cudd_Ref(q);
    }
    else
        Cudd_Ref(q);
    Cudd_RecursiveDerefZdd(dd, f0);
    Cudd_RecursiveDerefZdd(dd, g0);

    if (q == zero) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, gd);
        cuddCacheInsert2(dd, cuddZddWeakDivF, f, g, zero);
        Cudd_Deref(q);
        return(zero);
    }

    if (g1 != zero) {
        Cudd_RecursiveDerefZdd(dd, q);
        tmp = cuddZddWeakDivF(dd, f1, g1);
        if (tmp == NULL) {
            Cudd_RecursiveDerefZdd(dd, f1);
            Cudd_RecursiveDerefZdd(dd, g1);
            Cudd_RecursiveDerefZdd(dd, fd);
            Cudd_RecursiveDerefZdd(dd, gd);
            return(NULL);
        }
        Cudd_Ref(tmp);
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, g1);
        if (q == g)
            q = tmp;
        else {
            q = cuddZddIntersect(dd, q, tmp);
            if (q == NULL) {
                Cudd_RecursiveDerefZdd(dd, fd);
                Cudd_RecursiveDerefZdd(dd, gd);
                return(NULL);
            }
            Cudd_Ref(q);
            Cudd_RecursiveDerefZdd(dd, tmp);
        }
    }
    else {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, g1);
    }

    if (q == zero) {
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, gd);
        cuddCacheInsert2(dd, cuddZddWeakDivF, f, g, zero);
        Cudd_Deref(q);
        return(zero);
    }

    if (gd != zero) {
        Cudd_RecursiveDerefZdd(dd, q);
        tmp = cuddZddWeakDivF(dd, fd, gd);
        if (tmp == NULL) {
            Cudd_RecursiveDerefZdd(dd, fd);
            Cudd_RecursiveDerefZdd(dd, gd);
            return(NULL);
        }
        Cudd_Ref(tmp);
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, gd);
        if (q == g)
            q = tmp;
        else {
            q = cuddZddIntersect(dd, q, tmp);
            if (q == NULL) {
                Cudd_RecursiveDerefZdd(dd, tmp);
                return(NULL);
            }
            Cudd_Ref(q);
            Cudd_RecursiveDerefZdd(dd, tmp);
        }
    }
    else {
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, gd);
    }

    cuddCacheInsert2(dd, cuddZddWeakDivF, f, g, q);
    Cudd_Deref(q);
    return(q);

}